

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O3

bool __thiscall AgenPeeps::AgenDependentInstrs(AgenPeeps *this,Instr *instr1,Instr *instr2)

{
  RegOpnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  Opnd *opnd;
  Opnd *this_01;
  Opnd *pOVar5;
  Opnd *this_02;
  
  bVar2 = LowererMD::IsAssign(instr1);
  if (((bVar2) && (bVar2 = DependentInstrs(this,instr1,instr2), bVar2)) &&
     (OVar3 = IR::Opnd::GetKind(instr1->m_dst), OVar3 == OpndKindReg)) {
    if ((instr2->m_src1 == (Opnd *)0x0) ||
       (OVar3 = IR::Opnd::GetKind(instr2->m_src1), OVar3 != OpndKindIndir)) {
      pOVar5 = (Opnd *)0x0;
    }
    else {
      pOVar5 = instr2->m_src1;
      OVar3 = IR::Opnd::GetKind(pOVar5);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar2) goto LAB_0064d230;
        *puVar4 = 0;
      }
    }
    if ((instr2->m_src2 == (Opnd *)0x0) ||
       (OVar3 = IR::Opnd::GetKind(instr2->m_src2), OVar3 != OpndKindIndir)) {
      this_01 = (Opnd *)0x0;
    }
    else {
      this_01 = instr2->m_src2;
      OVar3 = IR::Opnd::GetKind(this_01);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar2) goto LAB_0064d230;
        *puVar4 = 0;
      }
    }
    if ((instr2->m_dst == (Opnd *)0x0) ||
       (OVar3 = IR::Opnd::GetKind(instr2->m_dst), OVar3 != OpndKindIndir)) {
      this_02 = (Opnd *)0x0;
    }
    else {
      this_02 = instr2->m_dst;
      OVar3 = IR::Opnd::GetKind(this_02);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar2) goto LAB_0064d230;
        *puVar4 = 0;
      }
    }
    this_00 = (RegOpnd *)instr1->m_dst;
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) {
LAB_0064d230:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    if (pOVar5 == (Opnd *)0x0) {
      if (this_01 == (Opnd *)0x0) {
        if (this_02 == (Opnd *)0x0) {
          return false;
        }
        opnd = (Opnd *)this_02[1]._vptr_Opnd;
        pOVar5 = *(Opnd **)&this_02[1].m_valueType;
      }
      else {
        opnd = (Opnd *)this_01[1]._vptr_Opnd;
        pOVar5 = *(Opnd **)&this_01[1].m_valueType;
      }
    }
    else {
      opnd = (Opnd *)pOVar5[1]._vptr_Opnd;
      pOVar5 = *(Opnd **)&pOVar5[1].m_valueType;
    }
    if ((opnd != (Opnd *)0x0) && (bVar2 = IR::RegOpnd::IsSameRegUntyped(this_00,opnd), bVar2)) {
      return true;
    }
    if (pOVar5 != (Opnd *)0x0) {
      bVar2 = IR::RegOpnd::IsSameRegUntyped(this_00,pOVar5);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool AgenPeeps::AgenDependentInstrs(IR::Instr *instr1, IR::Instr *instr2)
{
    // We only deal with assign instructions for now.
    if (!LowererMD::IsAssign(instr1) || !DependentInstrs(instr1, instr2))
        return false;

    if (instr1->GetDst()->IsRegOpnd())
    {
        IR::IndirOpnd *src1 = (instr2->GetSrc1() && instr2->GetSrc1()->IsIndirOpnd()) ? instr2->GetSrc1()->AsIndirOpnd() : nullptr;
        IR::IndirOpnd *src2 = (instr2->GetSrc2() && instr2->GetSrc2()->IsIndirOpnd()) ? instr2->GetSrc2()->AsIndirOpnd() : nullptr;
        IR::IndirOpnd *dst  = (instr2->GetDst()  && instr2->GetDst()->IsIndirOpnd())  ? instr2->GetDst()->AsIndirOpnd() : nullptr;
        IR::RegOpnd   *regOpnd = instr1->GetDst()->AsRegOpnd();

        IR::RegOpnd *base, *index;
        if (src1)
        {
            base = src1->GetBaseOpnd();
            index = src1->GetIndexOpnd();
            return (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index));
        }

        if (src2)
        {
            base = src2->GetBaseOpnd();
            index = src2->GetIndexOpnd();
            return (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index));
        }

        if (dst)
        {
            base = dst->GetBaseOpnd();
            index = dst->GetIndexOpnd();
            return (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index));
        }
    }
    return false;
}